

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O2

HPDF_UINT HPDF_StrLen(char *s,HPDF_INT maxlen)

{
  long lVar1;
  
  lVar1 = 0;
  if (s != (char *)0x0) {
    while( true ) {
      if ((s[lVar1] == '\0') || (-1 < maxlen && maxlen <= (int)lVar1)) break;
      lVar1 = lVar1 + 1;
    }
  }
  return (HPDF_UINT)lVar1;
}

Assistant:

HPDF_UINT
HPDF_StrLen  (const char   *s,
              HPDF_INT      maxlen)
{
    HPDF_INT len = 0;

    if (!s)
        return 0;

    while (*s != 0 && (maxlen < 0 || len < maxlen)) {
        s++;
        len++;
    }

    return (HPDF_UINT)len;
}